

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int seek_file(WFile *f,uint64_t offset,int whence)

{
  __off_t _Var1;
  
  if ((uint)whence < 3) {
    _Var1 = lseek(f->fd,offset,whence);
    return (int)(_Var1 >> 0x3f);
  }
  return -1;
}

Assistant:

int seek_file(WFile *f, uint64_t offset, int whence)
{
    int lseek_whence;

    switch (whence) {
    case FROM_START:
        lseek_whence = SEEK_SET;
        break;
    case FROM_CURRENT:
        lseek_whence = SEEK_CUR;
        break;
    case FROM_END:
        lseek_whence = SEEK_END;
        break;
    default:
        return -1;
    }

    return lseek(f->fd, offset, lseek_whence) >= 0 ? 0 : -1;
}